

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
fmt::v6::internal::vformat<char>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,basic_string_view<char> format_str,
          basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
          args)

{
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *buf;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_220;
  
  local_220.super_buffer<char>.ptr_ = local_220.store_;
  local_220.super_buffer<char>.size_ = 0;
  local_220.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_001cbc10;
  local_220.super_buffer<char>.capacity_ = 500;
  vformat_to<char>(&local_220.super_buffer<char>,format_str,args);
  to_string<char,500ul>(__return_storage_ptr__,(v6 *)&local_220,buf);
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer(&local_220);
  return __return_storage_ptr__;
}

Assistant:

inline std::basic_string<Char> internal::vformat(
    basic_string_view<Char> format_str,
    basic_format_args<buffer_context<Char>> args) {
  basic_memory_buffer<Char> buffer;
  internal::vformat_to(buffer, format_str, args);
  return to_string(buffer);
}